

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ravi_alloc.c
# Opt level: O3

mstate init_user_mstate(char *tbase,size_t tsize)

{
  char *pcVar1;
  mstate __s;
  char *pcVar2;
  flag_t fVar3;
  long lVar4;
  ulong uVar5;
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  
  uVar5 = (ulong)(-(int)tbase - 0x10U & 0xf);
  __s = (mstate)(tbase + uVar5 + 0x10);
  pcVar1 = tbase + uVar5;
  memset(__s,0,0x3b0);
  __s[-1].exts = 0x3b3;
  __s->least_addr = tbase;
  (__s->seg).base = tbase;
  __s->max_footprint = tsize;
  __s->footprint = tsize;
  (__s->seg).size = tsize;
  auVar6 = vpmovsxbq_avx512f(ZEXT816(0x303020201010000));
  auVar7 = vpmovsxbq_avx512f(ZEXT816(0x707060605050404));
  auVar8 = vpbroadcastq_avx512f(ZEXT816(8));
  auVar9 = vpbroadcastq_avx512f();
  __s->magic = mparams.magic;
  __s->release_checks = 0xfff;
  fVar3 = mparams.default_mflags;
  __s->extp = (void *)0x0;
  __s->exts = 0;
  auVar10 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
  __s->mflags = fVar3 | 4;
  lVar4 = 0x20;
  do {
    auVar11 = vpsllq_avx512f(auVar10,4);
    auVar10 = vpaddq_avx512f(auVar10,auVar8);
    lVar4 = lVar4 + -8;
    auVar12 = vpaddq_avx512f(auVar9,auVar11);
    auVar13 = vpermq_avx512f(auVar6,auVar12);
    auVar11 = vpermq_avx512f(auVar7,auVar12);
    auVar11 = vmovdqu64_avx512f(auVar11);
    *(undefined1 (*) [64])(auVar12._0_8_ + 0x50) = auVar11;
    auVar11 = vmovdqu64_avx512f(auVar13);
    *(undefined1 (*) [64])(auVar12._0_8_ + 0x10) = auVar11;
  } while (lVar4 != 0);
  uVar5 = (ulong)(-(int)pcVar1 - 0x3c0U & 0xf);
  *(char **)(pcVar1 + 0x38) = pcVar1 + uVar5 + 0x3b0;
  *(char **)(pcVar1 + 0x20) = tbase + ((tsize - (long)(pcVar1 + 0x3b0)) - uVar5) + -0x50;
  *(ulong *)(pcVar1 + uVar5 + 0x3b0 + 8) =
       (ulong)(tbase + ((tsize - (long)(pcVar1 + 0x3b0)) - uVar5) + -0x50) | 1;
  pcVar2 = tbase + (tsize - 0x48);
  pcVar2[0] = 'P';
  pcVar2[1] = '\0';
  pcVar2[2] = '\0';
  pcVar2[3] = '\0';
  pcVar2[4] = '\0';
  pcVar2[5] = '\0';
  pcVar2[6] = '\0';
  pcVar2[7] = '\0';
  *(size_t *)(pcVar1 + 0x40) = mparams.trim_threshold;
  return __s;
}

Assistant:

static mstate init_user_mstate(char* tbase, size_t tsize) {
  size_t msize = pad_request(sizeof(struct malloc_state));
  mchunkptr mn;
  mchunkptr msp = align_as_chunk(tbase);
  mstate m = (mstate)(chunk2mem(msp));
  memset(m, 0, msize);
  (void)INITIAL_LOCK(&m->mutex);
  msp->head = (msize|INUSE_BITS);
  m->seg.base = m->least_addr = tbase;
  m->seg.size = m->footprint = m->max_footprint = tsize;
  m->magic = mparams.magic;
  m->release_checks = MAX_RELEASE_CHECK_RATE;
  m->mflags = mparams.default_mflags;
  m->extp = 0;
  m->exts = 0;
  disable_contiguous(m);
  init_bins(m);
  mn = next_chunk(mem2chunk(m));
  init_top(m, mn, (size_t)((tbase + tsize) - (char*)mn) - TOP_FOOT_SIZE);
  check_top_chunk(m, m->top);
  return m;
}